

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::SingleFailureChecker::SingleFailureChecker
          (SingleFailureChecker *this,TestPartResultArray *results,Type type,string *substr)

{
  long lVar1;
  pointer pcVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->results_ = results;
  this->type_ = type;
  (this->substr_)._M_dataplus._M_p = (pointer)&(this->substr_).field_2;
  pcVar2 = (substr->_M_dataplus)._M_p;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::_M_construct<char*>((string *)&this->substr_);
    return;
  }
  __stack_chk_fail(this,pcVar2,pcVar2 + substr->_M_string_length);
}

Assistant:

SingleFailureChecker::SingleFailureChecker(const TestPartResultArray* results,
                                           TestPartResult::Type type,
                                           const std::string& substr)
    : results_(results), type_(type), substr_(substr) {}